

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

bool __thiscall capnp::anon_unknown_79::Input::tryConsume(Input *this,char expected)

{
  Input *this_00;
  char cVar1;
  
  if ((((this->wrapped).size_ != 0) &&
      (this_00 = (Input *)(this->wrapped).ptr, *(char *)&(this_00->wrapped).ptr != '\0')) &&
     (cVar1 = nextChar(this_00), cVar1 == expected)) {
    advance(this,1);
    return true;
  }
  return false;
}

Assistant:

bool tryConsume(char expected) {
    bool found = !exhausted() && nextChar() == expected;
    if (found) { advance(); }

    return found;
  }